

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O3

QVariant * __thiscall
Mustache::QtVariantContext::value
          (QVariant *__return_storage_ptr__,QtVariantContext *this,QString *key)

{
  QVariant *pQVar1;
  bool bVar2;
  int *piVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  QChar *pQVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  QByteArrayView QVar11;
  QStringList keyPath;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  QArrayDataPointer<QString> local_78;
  QArrayDataPointer<QString> local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined8 local_38;
  
  pQVar7 = (QChar *)(key->d).ptr;
  if (pQVar7 == (QChar *)0x0) {
    pQVar7 = (QChar *)&QString::_empty;
  }
  iVar5 = QString::compare_helper(pQVar7,(key->d).size,".",-1,CaseSensitive);
  if ((iVar5 == 0) && (lVar9 = (this->m_contextStack).super_QList<QVariant>.d.size, lVar9 != 0)) {
    ::QVariant::QVariant
              (__return_storage_ptr__,
               (QVariant *)((this->m_contextStack).super_QList<QVariant>.d.ptr + lVar9 + -1));
  }
  else {
    QVar11.m_data = (storage_type *)0x1;
    QVar11.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar11);
    local_98 = local_48;
    uStack_94 = uStack_44;
    uStack_90 = uStack_40;
    uStack_8c = uStack_3c;
    local_88 = local_38;
    QString::split(&local_78,key,&local_98,0,1);
    piVar3 = (int *)CONCAT44(uStack_94,local_98);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(uStack_94,local_98),2,8);
      }
    }
    uVar6 = (int)(this->m_contextStack).super_QList<QVariant>.d.size - 1;
    if (-1 < (int)uVar6) {
      lVar8 = (ulong)uVar6 << 5;
      lVar9 = (ulong)uVar6 + 1;
      do {
        pQVar1 = (this->m_contextStack).super_QList<QVariant>.d.ptr;
        local_60.d = local_78.d;
        local_60.ptr = local_78.ptr;
        local_60.size = local_78.size;
        if (local_78.d != (Data *)0x0) {
          LOCK();
          ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        variantMapValueForKeyPath
                  (__return_storage_ptr__,(QVariant *)((long)&(pQVar1->d).data + lVar8),
                   (QStringList *)&local_60);
        QArrayDataPointer<QString>::~QArrayDataPointer(&local_60);
        cVar4 = ::QVariant::isNull();
        if (cVar4 == '\0') goto LAB_00115d48;
        ::QVariant::~QVariant(__return_storage_ptr__);
        lVar8 = lVar8 + -0x20;
        lVar10 = lVar9 + -1;
        bVar2 = 0 < lVar9;
        lVar9 = lVar10;
      } while (lVar10 != 0 && bVar2);
    }
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
LAB_00115d48:
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

QVariant QtVariantContext::value(const QString& key) const
{
	if (key == "." && !m_contextStack.isEmpty()) {
		return m_contextStack.last();
	}
	QStringList keyPath = key.split(".");
	for (int i = m_contextStack.count()-1; i >= 0; i--) {
		QVariant value = variantMapValueForKeyPath(m_contextStack.at(i), keyPath);
		if (!value.isNull()) {
			return value;
		}
	}
	return QVariant();
}